

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void __thiscall
vsencoding::VSEncodingBlocks::encodeArray
          (VSEncodingBlocks *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  reference __src;
  uint *in_RCX;
  uint in_EDX;
  long in_RDI;
  long *in_R8;
  uint32_t csize;
  uint32_t *lout;
  uint32_t *lin;
  uint32_t res;
  uint32_t *in_stack_00000100;
  uint32_t *in_stack_00000108;
  uint32_t *in_stack_00000110;
  uint32_t in_stack_0000011c;
  VSEncodingBlocks *in_stack_00000120;
  uint local_44;
  uint *local_40;
  uint local_2c;
  
  local_40 = in_RCX + 1;
  *in_RCX = in_EDX;
  *in_R8 = 0;
  local_2c = in_EDX;
  while (*(uint *)(in_RDI + 8) < local_2c) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
    encodeVS(in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_00000108,
             in_stack_00000100);
    *local_40 = local_44;
    __src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),0);
    memcpy(local_40 + 1,__src,(ulong)local_44 << 2);
    local_2c = local_2c - *(int *)(in_RDI + 8);
    local_40 = local_40 + 1 + local_44;
    *in_R8 = (ulong)(local_44 + 1) + *in_R8;
  }
  encodeVS(in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_00000108,in_stack_00000100
          );
  *in_R8 = (ulong)local_44 + *in_R8;
  *in_R8 = *in_R8 + 1;
  return;
}

Assistant:

inline void VSEncodingBlocks::encodeArray(const uint32_t *in, const size_t len,
                                   uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initout(out);
#endif
  *(out++) = static_cast<uint32_t>(len);

  uint32_t res;
  const uint32_t *lin;
  uint32_t *lout;
  uint32_t csize;

  for (nvalue = 0, res = static_cast<uint32_t>(len), lin = in, lout = out;
       res > VSENCODING_BLOCKSZ; res -= VSENCODING_BLOCKSZ,
      lin += VSENCODING_BLOCKSZ, lout += csize, nvalue += csize + 1) {
    encodeVS(VSENCODING_BLOCKSZ, lin, csize, &__tmp[0]);
    *lout++ = csize;
    memcpy(lout, &__tmp[0], csize * sizeof(uint32_t));
  }

  encodeVS(res, lin, csize, lout);
  lout += csize;
  nvalue += csize;
  ++nvalue;
  ASSERT(nvalue + initout == lout,
    std::to_string(lout - initout) + " " + std::to_string(nvalue) + " " + std::to_string(csize));
}